

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

uint8_t MatchSorted(Size size)

{
  long lVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  uint mostSigBitIndex;
  Size size_local;
  
  if (size < 0x218) {
    __assert_fail("size >= NOT_EXACT_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,199,"uint8_t MatchSorted(Size)");
  }
  lVar1 = 0x3f;
  if (size != 0) {
    for (; size >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar2 = -((uint)lVar1 ^ 0x3f);
  uVar4 = iVar2 + 0x3f;
  if (8 < uVar4) {
    if ((uint)((iVar2 + 0x36) * 4) < 0x40) {
      cVar3 = (char)uVar4;
      size_local._7_1_ = (cVar3 + -9) * '\x04' | (byte)(size >> (cVar3 - 2U & 0x3f)) & 3;
    }
    else {
      size_local._7_1_ = 0x3f;
    }
    return size_local._7_1_;
  }
  __assert_fail("mostSigBitIndex >= 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0xcd,"uint8_t MatchSorted(Size)");
}

Assistant:

static uint8_t MatchSorted(Size size) {
    assert(size >= NOT_EXACT_MIN);
#ifndef __GNUC__
#error "GCC builtin is used."
#endif
    unsigned mostSigBitIndex =
            (unsigned) sizeof(Size) * 8 - __builtin_clzl(size) - 1;
    assert(mostSigBitIndex >= 9);
    if (((mostSigBitIndex - 9) << 2u) >= 64) {
        return 63;
    }
    return ((mostSigBitIndex - 9) << 2u) |
           ((size >> (mostSigBitIndex - 2u)) & 0x03u);
}